

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

void __thiscall pm::Camera::computeUvw(Camera *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar3 = (this->eye_).x - (this->lookAt_).x;
  fVar4 = (this->eye_).y - (this->lookAt_).y;
  fVar1 = (this->eye_).z - (this->lookAt_).z;
  (this->w_).x = fVar3;
  (this->w_).y = fVar4;
  (this->w_).z = fVar1;
  fVar1 = fVar1 * fVar1 + fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar5 = (this->w_).x / fVar1;
  (this->w_).x = fVar5;
  fVar2 = (this->w_).y / fVar1;
  (this->w_).y = fVar2;
  fVar1 = (this->w_).z / fVar1;
  (this->w_).z = fVar1;
  fVar3 = (this->up_).x;
  fVar4 = (this->up_).y;
  fVar7 = (this->up_).z;
  fVar6 = fVar4 * fVar1 - fVar2 * fVar7;
  fVar7 = fVar7 * fVar5 - fVar1 * fVar3;
  fVar1 = fVar2 * fVar3 - fVar5 * fVar4;
  (this->u_).x = fVar6;
  (this->u_).y = fVar7;
  (this->u_).z = fVar1;
  fVar1 = fVar1 * fVar1 + fVar6 * fVar6 + fVar7 * fVar7;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  fVar5 = (this->u_).x / fVar1;
  (this->u_).x = fVar5;
  fVar2 = (this->u_).y / fVar1;
  (this->u_).y = fVar2;
  fVar1 = (this->u_).z / fVar1;
  (this->u_).z = fVar1;
  fVar3 = (this->w_).y;
  fVar4 = (this->w_).z;
  fVar7 = (this->w_).x;
  (this->v_).x = fVar3 * fVar1 - fVar2 * fVar4;
  (this->v_).y = fVar4 * fVar5 - fVar1 * fVar7;
  (this->v_).z = fVar2 * fVar7 - fVar5 * fVar3;
  return;
}

Assistant:

void Camera::computeUvw()
{
	w_ = eye_ - lookAt_;
	w_.normalize();
	u_ = cross(up_, w_);
	u_.normalize();
	v_ = cross(w_, u_);

#if 0
	// take care of the singularity by hardwiring in specific camera orientations
	if (eye_.x == lookAt_.x && eye_.z == lookAt_.z && eye_.y > lookAt_.y)
	{
		// camera looking vertically down
		u_ = Vector3(0.0f, 0.0f, 1.0f);
		v_ = Vector3(1.0f, 0.0f, 0.0f);
		w_ = Vector3(0.0f, 1.0f, 0.0f);
	}

	if (eye_.x == lookAt_.x && eye_.z == lookAt_.z && eye_.y < lookAt_.y)
	{
		// camera looking vertically up
		u_ = Vector3(1.0f, 0.0f, 0.0f);
		v_ = Vector3(0.0f, 0.0f, 1.0f);
		w_ = Vector3(0.0f, -1.0f, 0.0f);
	}
#endif
}